

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_names.cc
# Opt level: O2

bool __thiscall prometheus::CheckMetricName(prometheus *this,string *name)

{
  _Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::__0> *p_Var1;
  bool bVar2;
  _Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::__0> *this_00;
  long lVar3;
  long lVar4;
  _Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::__0> *p_Var5;
  
  bVar2 = anon_unknown_3::nameStartsValid((string *)this);
  if (!bVar2) {
    return false;
  }
  this_00 = *(_Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::__0> **)this;
  lVar3 = *(long *)(this + 8);
  p_Var1 = this_00 + lVar3;
  for (lVar4 = lVar3 >> 2; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::$_0>::operator()
                      (this_00,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )name);
    p_Var5 = this_00;
    if (bVar2) goto LAB_0014f845;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::$_0>::operator()
                      (this_00 + 1,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )name);
    p_Var5 = this_00 + 1;
    if (bVar2) goto LAB_0014f845;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::$_0>::operator()
                      (this_00 + 2,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )name);
    p_Var5 = this_00 + 2;
    if (bVar2) goto LAB_0014f845;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::$_0>::operator()
                      (this_00 + 3,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )name);
    p_Var5 = this_00 + 3;
    if (bVar2) goto LAB_0014f845;
    this_00 = this_00 + 4;
    lVar3 = lVar3 + -4;
  }
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      p_Var5 = p_Var1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::$_0>::
                  operator()(this_00,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )name), p_Var5 = this_00, bVar2)) goto LAB_0014f845;
      this_00 = this_00 + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::$_0>::operator()
                      (this_00,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )name);
    p_Var5 = this_00;
    if (bVar2) goto LAB_0014f845;
    this_00 = this_00 + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_negate<prometheus::CheckMetricName(std::__cxx11::string_const&)::$_0>::operator()
                    (this_00,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )name);
  p_Var5 = this_00;
  if (!bVar2) {
    p_Var5 = p_Var1;
  }
LAB_0014f845:
  return p_Var5 == p_Var1;
}

Assistant:

bool CheckMetricName(const std::string& name) {
  if (!nameStartsValid(name)) {
    return false;
  }

  auto validMetricCharacters = [](char c) {
    return isLocaleIndependentAlphaNumeric(c) || c == '_' || c == ':';
  };

  auto mismatch =
      std::find_if_not(std::begin(name), std::end(name), validMetricCharacters);
  return mismatch == std::end(name);
}